

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O2

void print_element_segment_info(element_segment sec)

{
  uint uVar1;
  int j;
  ulong uVar2;
  element_pointer paVar3;
  ulong uVar4;
  
  paVar3 = sec.element_segment_addr;
  for (uVar4 = 0; uVar4 != (sec._0_8_ & 0xffffffff); uVar4 = uVar4 + 1) {
    uVar1 = *paVar3[uVar4].offset.arg;
    printf("  - element[%d] table=0 offset=%d count=%d\n",uVar4 & 0xffffffff,(ulong)uVar1,
           (ulong)paVar3[uVar4].init_data_count);
    for (uVar2 = 0; uVar2 < paVar3[uVar4].init_data_count; uVar2 = uVar2 + 1) {
      printf("   - ele[%d] =func[%d]\n",(ulong)(uVar1 + (int)uVar2),
             (ulong)paVar3[uVar4].init_data[uVar2]);
    }
  }
  return;
}

Assistant:

void print_element_segment_info(element_segment sec) {
    element_pointer ep;
    uint32 offset;
    for (int i = 0; i < sec.element_segment_count; ++i) {
        ep = sec.element_segment_addr + i;
        offset = *(uint32 *) (ep->offset.arg);
        printf("  - element[%d] table=0 offset=%d count=%d\n", i, offset, ep->init_data_count);
        for (int j = 0; j < ep->init_data_count; ++j) {
            printf("   - ele[%d] =func[%d]\n", j + offset, *(uint32 *) (ep->init_data + j));
        }
    }
}